

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t x;
  wchar_t y;
  wchar_t n_00;
  wchar_t *pwVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  loc_conflict lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  wchar_t *pwVar9;
  ulong uVar10;
  long lVar11;
  wchar_t vc;
  ui_entry_combiner_funcs_conflict combiner;
  ui_entry_combiner_state_conflict cst;
  wchar_t local_8c;
  wchar_t *local_88;
  wchar_t local_7c;
  wchar_t local_78;
  wchar_t local_74;
  wchar_t *local_70;
  ulong local_68;
  ui_entry_combiner_funcs local_60;
  ui_entry_combiner_state local_40;
  
  uVar7 = 7;
  if (details->alternate_color_first == false) {
    uVar7 = 0;
  }
  local_88 = auxvals;
  if (((L'\x15' < info->ncolors) && (L'\t' < info->nlabcolors)) && (L'\n' < info->nsym)) {
    lVar5.y = 0;
    lVar5.x = (details->value_position).x;
    uVar10 = (ulong)(uint)(details->value_position).y;
    local_74 = nlabel;
    local_70 = label;
    iVar2 = ui_entry_combiner_get_funcs(info->combiner_index,&local_60);
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                    ,0x43f,
                    "void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                   );
    }
    local_7c = n;
    if (L'\0' < n) {
      local_68 = (ulong)(uint)n;
      uVar8 = 0;
      do {
        (*local_60.init_func)(vals[uVar8],0,&local_40);
        (*local_60.accum_func)(local_88[uVar8],0,&local_40);
        (*local_60.finish_func)(&local_40);
        uVar4 = 0;
        if (((vals[uVar8] != L'\x7fffffff') &&
            ((vals[uVar8] != L'\0' || (uVar4 = 0, local_88[uVar8] != L'\x7fffffff')))) &&
           (uVar4 = 1, local_40.accum != 0x7ffffffe)) {
          iVar2 = (uint)(local_88[uVar8] != L'\0') * 2;
          if (L'\0' < local_88[uVar8]) {
            iVar2 = 1;
          }
          iVar3 = 8;
          if (local_40.accum == 0) {
            iVar3 = 2;
          }
          if (0 < local_40.accum) {
            iVar3 = 5;
          }
          uVar4 = iVar3 + iVar2;
        }
        Term_putch(lVar5.x,(wchar_t)uVar10,info->colors[uVar4 + uVar7],info->symbols[uVar4]);
        lVar5 = loc_sum((loc_conflict)((ulong)lVar5 & 0xffffffff | uVar10 << 0x20),
                        (loc_conflict)details->position_step);
        uVar10 = (ulong)lVar5 >> 0x20;
        uVar7 = uVar7 ^ 0xb;
        uVar8 = uVar8 + 1;
      } while (local_68 != uVar8);
    }
    n_00 = local_74;
    if ((L'\0' < local_74) || (details->show_combined == true)) {
      (*local_60.vec_func)(local_7c,vals,local_88,&local_78,&local_8c);
      if (L'\0' < n_00) {
        if (details->known_rune == true) {
          (*local_60.init_func)(local_78,0,&local_40);
          (*local_60.accum_func)(local_8c,0,&local_40);
          (*local_60.finish_func)(&local_40);
          lVar11 = 1;
          if (local_40.accum < 0x7ffffffe) {
            uVar10 = (ulong)((uint)(local_8c != L'\0') * 2);
            if (L'\0' < local_8c) {
              uVar10 = 1;
            }
            lVar6 = 7;
            if (local_40.accum == 0) {
              lVar6 = 1;
            }
            lVar11 = 4;
            if (local_40.accum < 1) {
              lVar11 = lVar6;
            }
            lVar11 = lVar11 + uVar10;
          }
        }
        else {
          lVar11 = 0;
        }
        pwVar1 = local_70;
        x = (details->label_position).x;
        y = (details->label_position).y;
        if (details->vertical_label == true) {
          local_88 = (wchar_t *)0x1;
          if (L'\x01' < n_00) {
            local_88 = (wchar_t *)(ulong)(uint)n_00;
          }
          pwVar9 = (wchar_t *)0x0;
          do {
            Term_putch(x,(int)pwVar9 + y,info->label_colors[lVar11],pwVar1[(long)pwVar9]);
            pwVar9 = (wchar_t *)((long)pwVar9 + 1);
          } while (local_88 != pwVar9);
        }
        else {
          safe_queue_chars(x,y,n_00,info->label_colors[lVar11],local_70);
        }
      }
      if (details->show_combined == true) {
        show_combined_generic(info,details,local_78,local_8c);
      }
    }
    return;
  }
  __assert_fail("info->ncolors >= 22 && info->nlabcolors >= 10 && info->nsym >= 11",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                ,0x43c,
                "void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 7 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 22 && info->nlabcolors >= 10
		&& info->nsym >= 11);

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}

	for (i = 0; i < n; ++i) {
		struct ui_entry_combiner_state cst;
		int palette_index;

		(*combiner.init_func)(vals[i], 0, &cst);
		(*combiner.accum_func)(auxvals[i], 0, &cst);
		(*combiner.finish_func)(&cst);
		if (vals[i] == UI_ENTRY_UNKNOWN_VALUE || (vals[i] == 0
				&& auxvals[i] == UI_ENTRY_UNKNOWN_VALUE)) {
			palette_index = 0;
		} else if (cst.accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 1;
		} else {
			palette_index =
				((cst.accum > 0) ?
					5 : ((cst.accum < 0) ? 8 : 2))
				+ ((auxvals[i] > 0) ?
					1 : ((auxvals[i] < 0) ? 2 : 0));
		}
		Term_putch(p.x, p.y,
			info->colors[palette_index + color_offset],
			info->symbols[palette_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 11;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int palette_index;

		if (!details->known_rune) {
			palette_index = 0;
		} else {
			struct ui_entry_combiner_state cst;

			(*combiner.init_func)(vc, 0, &cst);
			(*combiner.accum_func)(ac, 0, &cst);
			(*combiner.finish_func)(&cst);
			if (cst.accum == UI_ENTRY_UNKNOWN_VALUE
					|| cst.accum == UI_ENTRY_VALUE_NOT_PRESENT) {
				palette_index = 1;
			} else {
				palette_index =
					((cst.accum > 0) ? 4 :
						((cst.accum < 0) ? 7 : 1))
					+ ((ac > 0) ? 1 : ((ac < 0) ? 2 : 0));
			}
		}
		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}